

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_errno.c
# Opt level: O3

ngx_int_t ngx_strerror_init(void)

{
  uint __errnum;
  ngx_str_t *pnVar1;
  char *pcVar2;
  void *__dest;
  uint *puVar3;
  ngx_int_t nVar4;
  long lVar5;
  size_t __size;
  long lVar6;
  
  __size = 0x6b0;
  ngx_sys_errlist = (ngx_str_t *)malloc(0x6b0);
  if (ngx_sys_errlist == (ngx_str_t *)0x0) {
LAB_001317ec:
    puVar3 = (uint *)__errno_location();
    __errnum = *puVar3;
    pcVar2 = strerror(__errnum);
    ngx_log_stderr(0,"malloc(%uz) failed (%d: %s)",__size,(ulong)__errnum,pcVar2);
    nVar4 = -1;
  }
  else {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pcVar2 = strerror((int)lVar6);
      __size = strlen(pcVar2);
      __dest = malloc(__size);
      if (__dest == (void *)0x0) goto LAB_001317ec;
      memcpy(__dest,pcVar2,__size);
      pnVar1 = ngx_sys_errlist;
      *(size_t *)((long)ngx_sys_errlist + lVar5 + -8) = __size;
      *(void **)((long)&pnVar1->len + lVar5) = __dest;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 != 0x6b);
    nVar4 = 0;
  }
  return nVar4;
}

Assistant:

ngx_int_t
ngx_strerror_init(void)
{
    char       *msg;
    u_char     *p;
    size_t      len;
    ngx_err_t   err;

    /*
     * ngx_strerror() is not ready to work at this stage, therefore,
     * malloc() is used and possible errors are logged using strerror().
     */

    len = NGX_SYS_NERR * sizeof(ngx_str_t);

    ngx_sys_errlist = malloc(len);
    if (ngx_sys_errlist == NULL) {
        goto failed;
    }

    for (err = 0; err < NGX_SYS_NERR; err++) {
        msg = strerror(err);
        len = ngx_strlen(msg);

        p = malloc(len);
        if (p == NULL) {
            goto failed;
        }

        ngx_memcpy(p, msg, len);
        ngx_sys_errlist[err].len = len;
        ngx_sys_errlist[err].data = p;
    }

    return NGX_OK;

failed:

    err = errno;
    ngx_log_stderr(0, "malloc(%uz) failed (%d: %s)", len, err, strerror(err));

    return NGX_ERROR;
}